

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstracttxin.cpp
# Opt level: O0

void __thiscall
AbstractTxIn_WitnessStackError_Test::TestBody(AbstractTxIn_WitnessStackError_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_188;
  AssertHelper local_168;
  Message local_160;
  bool local_151;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  CfdException *e;
  allocator local_f9;
  string local_f8 [32];
  ByteData local_d8;
  ScriptWitness local_c0;
  undefined1 local_a0 [8];
  AbstractTxIn actual;
  AbstractTxIn_WitnessStackError_Test *this_local;
  
  actual.script_witness_.witness_stack_.
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  cfd::core::AbstractTxIn::AbstractTxIn
            ((AbstractTxIn *)local_a0,&expect_txid,1,0xffffffff,&expect_unlocking_script);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"0123456789",&local_f9);
  cfd::core::ByteData::ByteData(&local_d8,local_f8);
  cfd::core::AbstractTxIn::SetScriptWitnessStack((uint)&local_c0,(ByteData *)local_a0);
  cfd::core::ScriptWitness::~ScriptWitness(&local_c0);
  cfd::core::ByteData::~ByteData(&local_d8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  local_151 = false;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_150,&local_151,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_188,(internal *)local_150,(AssertionResult *)0x5118f0,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstracttxin.cpp"
               ,0x77,message);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    testing::Message::~Message(&local_160);
  }
  gtest_ar_.message_.ptr_._5_3_ = 0;
  gtest_ar_.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  if (gtest_ar_.message_.ptr_._4_4_ == 0) {
    gtest_ar_.message_.ptr_._4_4_ = 0;
  }
  cfd::core::AbstractTxIn::~AbstractTxIn((AbstractTxIn *)local_a0);
  return;
}

Assistant:

TEST(AbstractTxIn, WitnessStackError) {
  AbstractTxIn actual = AbstractTxIn(expect_txid, expect_index, expect_sequence,
                                     expect_unlocking_script);

  try {
    actual.SetScriptWitnessStack(0, ByteData("0123456789"));
  } catch (const CfdException &e) {
    EXPECT_STREQ(e.what(), "vin out_of_range error.");
    return;
  }
  ASSERT_TRUE(false);
}